

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::decodeBlock
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,uint32_t *out,
          size_t *nvalue)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  reference pvVar4;
  long *in_RCX;
  long in_RDX;
  uint *in_RSI;
  uint32_t *in_RDI;
  uint32_t lpos;
  uint32_t e;
  uint32_t j;
  uint32_t *beginout;
  size_t twonexceptions;
  uint32_t encodedExceptionsSize;
  size_t nExceptions;
  uint32_t b;
  uint32_t *initout;
  size_t *in_stack_ffffffffffffff80;
  uint *in_stack_ffffffffffffff88;
  uint32_t *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint local_58;
  uint local_54;
  long local_18;
  uint *local_10;
  
  uVar1 = *in_RSI;
  uVar3 = (ulong)(*in_RSI >> 0x10 & 0x3ff);
  uVar2 = *in_RSI & 0xffff;
  if (uVar2 != 0) {
    in_stack_ffffffffffffff80 = (size_t *)(in_RDI + 2);
    in_stack_ffffffffffffff90 = (uint32_t *)(ulong)uVar2;
    in_stack_ffffffffffffff88 = in_RSI + 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),0);
    Simple16<false>::decodeArray
              ((Simple16<false> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_RDI,(size_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80);
  }
  local_10 = in_RSI + 1 + uVar2;
  local_18 = in_RDX;
  for (local_54 = 0; local_54 < 0x80; local_54 = local_54 + 0x20) {
    fastunpack(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (uint32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    local_10 = local_10 + (uVar1 >> 0x1a);
    local_18 = local_18 + 0x80;
  }
  uVar2 = 0xffffffff;
  for (local_58 = 0; local_58 < uVar3; local_58 = local_58 + 1) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),
                        (ulong)local_58);
    uVar2 = *pvVar4 + 1 + uVar2;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),
                        local_58 + uVar3);
    *(value_type *)(in_RDX + (ulong)uVar2 * 4) =
         *pvVar4 + 1 << ((byte)(uVar1 >> 0x1a) & 0x1f) | *(uint *)(in_RDX + (ulong)uVar2 * 4);
  }
  *in_RCX = local_18 - in_RDX >> 2;
  return local_10;
}

Assistant:

const uint32_t *
NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::decodeBlock(
    const uint32_t *in, uint32_t *out, size_t &nvalue) {
  const uint32_t *const initout(out);
  const uint32_t b = *in >> (32 - PFORDELTA_B);
  const size_t nExceptions = (*in >> (32 - (PFORDELTA_B + PFORDELTA_NEXCEPT))) &
                             ((1 << PFORDELTA_NEXCEPT) - 1);
  const uint32_t encodedExceptionsSize = *in & ((1 << PFORDELTA_EXCEPTSZ) - 1);

  size_t twonexceptions = 2 * nExceptions;
  ++in;
  if (encodedExceptionsSize > 0)
    ecoder.decodeArray(in, encodedExceptionsSize, &exceptions[0],
                       twonexceptions);
  assert(twonexceptions >= 2 * nExceptions);
  in += encodedExceptionsSize;

  uint32_t *beginout(out); // we use this later

  for (uint32_t j = 0; j < BlockSize; j += 32) {
    fastunpack(in, out, b);
    in += b;
    out += 32;
  }

  for (uint32_t e = 0, lpos = 0u-1; e < nExceptions; e++) {
    lpos += exceptions[e] + 1;
    beginout[lpos] |= (exceptions[e + nExceptions] + 1) << b;
  }

  nvalue = out - initout;
  return in;
}